

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *this,
          DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true> *this_00;
  SimpleDictionaryPropertyDescriptor<int> *pSVar4;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_01;
  int index;
  
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x23b,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = ConvertToTypeHandler<Js::SimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,true>,Js::JavascriptString*>
                      (this,instance);
  if (((byte)this[0x28] & 2) == 0) {
    this_01 = *(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                **)(this + 0x18);
    if (0 < this_01->count - this_01->freeCount) {
      index = 0;
      do {
        pSVar4 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetValueAt(this_01,index);
        if ((pSVar4->Attributes & 8) != 0) {
          SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_true>::
          TryRegisterDeletedPropertyIndex(this_00,instance,pSVar4->propertyIndex);
        }
        index = index + 1;
        this_01 = *(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                    **)(this + 0x18);
      } while (index < this_01->count - this_01->freeCount);
    }
  }
  else if (*(int *)(this + 0x30) != -1) {
    this_00->deletedPropertyIndex = *(int *)(this + 0x30);
  }
  return this_00;
}

Assistant:

SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToSimpleDictionaryUnorderedTypeHandler(DynamicObject* instance)
    {
        CompileAssert(sizeof(NewTPropertyIndex) >= sizeof(TPropertyIndex));
        Assert(instance);

        SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported> *const newTypeHandler =
            ConvertToTypeHandler<SimpleDictionaryUnorderedTypeHandler<NewTPropertyIndex, NewTMapKey, NewIsNotExtensibleSupported>, NewTMapKey>(instance);

        if(isUnordered)
        {
            newTypeHandler->CopyUnorderedStateFrom(*AsUnordered(), instance);
        }
        else
        {
            for(int i = 0; i < propertyMap->Count(); ++i)
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(i));
                if(descriptor.Attributes & PropertyDeleted)
                {
                    newTypeHandler->TryRegisterDeletedPropertyIndex(instance, descriptor.propertyIndex);
                }
            }
        }

        return newTypeHandler;
    }